

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

ImGuiOldColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  ImGuiOldColumns *__src;
  int iVar1;
  ImGuiOldColumns *pIVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined1 local_b0 [104];
  void *local_48;
  ImDrawListSplitter local_40;
  
  iVar4 = (window->ColumnsStorage).Size;
  lVar5 = (long)iVar4;
  if (0 < lVar5) {
    pIVar2 = (window->ColumnsStorage).Data;
    do {
      if (pIVar2->ID == id) {
        return pIVar2;
      }
      pIVar2 = pIVar2 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  memset(local_b0,0,0x88);
  if (iVar4 == (window->ColumnsStorage).Capacity) {
    if (iVar4 == 0) {
      iVar1 = 8;
    }
    else {
      iVar1 = iVar4 / 2 + iVar4;
    }
    iVar3 = iVar4 + 1;
    if (iVar4 + 1 < iVar1) {
      iVar3 = iVar1;
    }
    pIVar2 = (ImGuiOldColumns *)MemAlloc((long)iVar3 * 0x88);
    __src = (window->ColumnsStorage).Data;
    if (__src != (ImGuiOldColumns *)0x0) {
      memcpy(pIVar2,__src,(long)(window->ColumnsStorage).Size * 0x88);
      MemFree((window->ColumnsStorage).Data);
    }
    (window->ColumnsStorage).Data = pIVar2;
    (window->ColumnsStorage).Capacity = iVar3;
    iVar4 = (window->ColumnsStorage).Size;
  }
  else {
    pIVar2 = (window->ColumnsStorage).Data;
  }
  memcpy(pIVar2 + iVar4,local_b0,0x88);
  (window->ColumnsStorage).Size = (window->ColumnsStorage).Size + 1;
  ImDrawListSplitter::ClearFreeMemory(&local_40);
  if (local_40._Channels.Data != (ImDrawChannel *)0x0) {
    MemFree(local_40._Channels.Data);
  }
  if (local_48 != (void *)0x0) {
    MemFree(local_48);
  }
  pIVar2 = (window->ColumnsStorage).Data + (long)(window->ColumnsStorage).Size + -1;
  pIVar2->ID = id;
  return pIVar2;
}

Assistant:

ImGuiOldColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiOldColumns());
    ImGuiOldColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}